

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O3

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createRealloc(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  uint uVar1;
  int iVar2;
  RWNode *node;
  size_t sVar3;
  long lVar4;
  size_t size;
  size_t *psVar5;
  GenericDefSite<dg::dda::RWNode> local_48;
  
  node = ReadWriteGraph::create(&this->graph,DYN_ALLOC);
  size = Offset::UNKNOWN;
  if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
    lVar4 = (long)Inst - (ulong)(*(uint *)(Inst + 0x14) << 5);
  }
  else {
    lVar4 = *(long *)(Inst + -8);
  }
  lVar4 = *(long *)(lVar4 + 0x20);
  sVar3 = Offset::UNKNOWN;
  if ((lVar4 == 0) || (*(char *)(lVar4 + 0x10) != '\x10')) {
LAB_00110842:
    if (sVar3 == 0) goto LAB_00110851;
  }
  else {
    uVar1 = *(uint *)(lVar4 + 0x20);
    psVar5 = (size_t *)(lVar4 + 0x18);
    if (uVar1 < 0x41) {
LAB_00110835:
      if (0x40 < uVar1) {
        psVar5 = (size_t *)*psVar5;
      }
      sVar3 = *psVar5;
      goto LAB_00110842;
    }
    iVar2 = llvm::APInt::countLeadingZerosSlowCase();
    sVar3 = 0xffffffffffffffff;
    if (uVar1 - iVar2 < 0x41) goto LAB_00110835;
  }
  (node->super_SubgraphNode<dg::dda::RWNode>).size = sVar3;
  size = sVar3;
LAB_00110851:
  local_48.offset.offset = 0;
  local_48.target = node;
  local_48.len.offset = size;
  std::
  _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
  ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
            ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
              *)&node->annotations,&local_48);
  if (this->buildUses == true) {
    addReallocUses(this,Inst,node,size);
  }
  return node;
}

Assistant:

RWNode *
LLVMReadWriteGraphBuilder::createRealloc(const llvm::Instruction *Inst) {
    RWNode &node = create(RWNodeType::DYN_ALLOC);

    uint64_t size = llvmutils::getConstantValue(Inst->getOperand(1));
    if (size == 0)
        size = Offset::UNKNOWN;
    else
        node.setSize(size);

    // realloc defines itself, since it copies the values
    // from previous memory
    node.addDef(&node, 0, size, false /* strong update */);

    if (buildUses) {
        // realloc copies the memory
        // NOTE: do not use mapPointers, it could lead to infinite
        // recursion as realloc may use itself and the 'node' is not
        // in the map yet
        addReallocUses(Inst, node, size);
    }
    return &node;
}